

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O2

void __thiscall QPDF::removeSecurityRestrictions(QPDF *this)

{
  bool bVar1;
  QPDFObjectHandle acroform;
  QPDFObjectHandle root;
  allocator<char> local_59;
  _Alloc_hider in_stack_ffffffffffffffa8;
  QPDFObjectHandle local_38;
  QPDFObjectHandle local_28;
  
  getRoot((QPDF *)&stack0xffffffffffffffe8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffffa8,"/Perms",(allocator<char> *)&local_38);
  QPDFObjectHandle::removeKey
            ((QPDFObjectHandle *)&stack0xffffffffffffffe8,(string *)&stack0xffffffffffffffa8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffffa8,"/AcroForm",(allocator<char> *)&local_28);
  QPDFObjectHandle::getKey(&local_38,(string *)&stack0xffffffffffffffe8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  bVar1 = QPDFObjectHandle::isDictionary(&local_38);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xffffffffffffffa8,"/SigFlags",(allocator<char> *)&local_28);
    bVar1 = QPDFObjectHandle::hasKey(&local_38,(string *)&stack0xffffffffffffffa8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xffffffffffffffa8,"/SigFlags",&local_59);
      QPDFObjectHandle::newInteger((longlong)in_stack_ffffffffffffffa8._M_p);
      QPDFObjectHandle::replaceKey(&local_38,(string *)&stack0xffffffffffffffa8,&local_28);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_28.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffff0);
  return;
}

Assistant:

void
QPDF::removeSecurityRestrictions()
{
    auto root = getRoot();
    root.removeKey("/Perms");
    auto acroform = root.getKey("/AcroForm");
    if (acroform.isDictionary() && acroform.hasKey("/SigFlags")) {
        acroform.replaceKey("/SigFlags", QPDFObjectHandle::newInteger(0));
    }
}